

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::visitSelection
          (TGlslangToSpvTraverser *this,TVisit param_1,TIntermSelection *node)

{
  Builder *pBVar1;
  Instruction *pIVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Id IVar6;
  int iVar7;
  TLayoutPacking TVar8;
  Id IVar9;
  Id rValue;
  Id rValue_00;
  Id IVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *pTVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar13;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  long lVar14;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TGlslangToSpvTraverser *pTVar15;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  pointer ppIVar16;
  ulong uVar17;
  Decoration DVar18;
  Id typeId;
  undefined4 in_register_00000034;
  char *filename;
  If ifBuilder;
  If local_68;
  undefined4 extraout_var_12;
  
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])
                    (node,CONCAT44(in_register_00000034,param_1));
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar5),this);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(node);
  pTVar12 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0xf0))
                               ((long *)CONCAT44(extraout_var_00,iVar5));
  IVar6 = accessChainLoad(this,pTVar12);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
  if ((CONCAT44(extraout_var_01,iVar5) == 0) ||
     (iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node),
     CONCAT44(extraout_var_02,iVar5) == 0)) {
LAB_004386b5:
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(node);
    if (iVar5 == 0) {
      IVar9 = 0;
    }
    else {
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar5) + 0x58))
                         ((long *)CONCAT44(extraout_var_22,iVar5));
      DVar18 = DecorationMax;
      if ((*(uint *)(lVar14 + 8) >> 0x19 & 7) - 1 < 2) {
        DVar18 = DecorationRelaxedPrecision;
      }
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      pTVar15 = (TGlslangToSpvTraverser *)CONCAT44(extraout_var_23,iVar5);
      TVar8 = getExplicitLayout(pTVar15,pTVar12);
      iVar5 = (*(pTVar15->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(pTVar15);
      IVar9 = convertGlslangToSpvType
                        (this,(TType *)pTVar15,TVar8,(TQualifier *)CONCAT44(extraout_var_24,iVar5),
                         false,false);
      IVar9 = spv::Builder::createVariable(&this->builder,DVar18,Function,IVar9,(char *)0x0,0,true);
    }
    uVar11 = 1;
    if (node->flatten == false) {
      uVar11 = (node->dontFlatten & 1) * 2;
    }
    pBVar1 = &this->builder;
    spv::Builder::If::If(&local_68,IVar6,uVar11,pBVar1);
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
    if (CONCAT44(extraout_var_25,iVar5) != 0) {
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar5) + 0x10))
                ((long *)CONCAT44(extraout_var_26,iVar5),this);
      if (IVar9 != 0) {
        iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
        plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_27,iVar5) + 0x18))
                                    ((long *)CONCAT44(extraout_var_27,iVar5));
        pTVar12 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
        IVar6 = accessChainLoad(this,pTVar12);
        spv::Builder::clearAccessChain(pBVar1);
        spv::Builder::setAccessChainLValue(pBVar1,IVar9);
        iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
        multiTypeStore(this,(TType *)CONCAT44(extraout_var_28,iVar5),IVar6);
      }
    }
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
    if (CONCAT44(extraout_var_29,iVar5) == 0) {
      spv::Builder::If::makeEndIf(&local_68);
      if (IVar9 == 0) {
        return false;
      }
    }
    else {
      spv::Builder::If::makeBeginElse(&local_68);
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
      (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar5) + 0x10))
                ((long *)CONCAT44(extraout_var_30,iVar5),this);
      if (IVar9 == 0) {
        spv::Builder::If::makeEndIf(&local_68);
        return false;
      }
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_31,iVar5) + 0x18))
                                  ((long *)CONCAT44(extraout_var_31,iVar5));
      pTVar12 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
      IVar6 = accessChainLoad(this,pTVar12);
      spv::Builder::clearAccessChain(pBVar1);
      spv::Builder::setAccessChainLValue(pBVar1,IVar9);
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      multiTypeStore(this,(TType *)CONCAT44(extraout_var_32,iVar5),IVar6);
      spv::Builder::If::makeEndIf(&local_68);
    }
    spv::Builder::clearAccessChain(pBVar1);
    spv::Builder::setAccessChainLValue(pBVar1,IVar9);
    return false;
  }
  if (node->shortCircuit == true) {
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(node);
    if (iVar5 == 0) goto LAB_004386b5;
    if ((this->glslangIntermediate->spvVersion).spv < 0x10400) {
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0xc0))
                        ((long *)CONCAT44(extraout_var_03,iVar5));
      if (cVar3 == '\0') {
        iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
        cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0xd8))
                          ((long *)CONCAT44(extraout_var_04,iVar5));
        if (cVar3 == '\0') goto LAB_004386b5;
      }
    }
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    iVar7 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 0x18))
                                ((long *)CONCAT44(extraout_var_06,iVar7));
    pTVar12 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
    bVar4 = glslang::TType::operator==((TType *)CONCAT44(extraout_var_05,iVar5),pTVar12);
    if (!bVar4) {
LAB_00438b16:
      __assert_fail("node->getType() == node->getTrueBlock() ->getAsTyped()->getType() && node->getType() == node->getFalseBlock()->getAsTyped()->getType()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x1137,
                    "auto (anonymous namespace)::TGlslangToSpvTraverser::visitSelection(glslang::TVisit, glslang::TIntermSelection *)::(anonymous class)::operator()() const"
                   );
    }
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    iVar7 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar7) + 0x18))
                                ((long *)CONCAT44(extraout_var_08,iVar7));
    pTVar12 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
    bVar4 = glslang::TType::operator==((TType *)CONCAT44(extraout_var_07,iVar5),pTVar12);
    if (!bVar4) goto LAB_00438b16;
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar5) + 0x18))
                                ((long *)CONCAT44(extraout_var_09,iVar5));
    lVar14 = (**(code **)(*plVar13 + 0x60))(plVar13);
    if (lVar14 == 0) {
      plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
      lVar14 = (**(code **)(*plVar13 + 0x58))(plVar13);
      if ((*(ulong *)(lVar14 + 8) & 0x10000007f) != 2 && (*(ulong *)(lVar14 + 8) >> 0x20 & 1) == 0)
      goto LAB_004386b5;
    }
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
    plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar5) + 0x18))
                                ((long *)CONCAT44(extraout_var_10,iVar5));
    lVar14 = (**(code **)(*plVar13 + 0x60))(plVar13);
    if (lVar14 == 0) {
      plVar13 = (long *)(**(code **)(*plVar13 + 0xf0))(plVar13);
      lVar14 = (**(code **)(*plVar13 + 0x58))(plVar13);
      if ((*(ulong *)(lVar14 + 8) & 0x10000007f) != 2 && (*(ulong *)(lVar14 + 8) >> 0x20 & 1) == 0)
      goto LAB_004386b5;
    }
  }
  bVar4 = (this->builder).generatingOpCodeForSpecConst;
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar5) + 0x58))
                     ((long *)CONCAT44(extraout_var_11,iVar5));
  if ((*(byte *)(lVar14 + 0xc) & 1) != 0) {
    (this->builder).generatingOpCodeForSpecConst = true;
  }
  pBVar1 = &this->builder;
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
  pTVar15 = (TGlslangToSpvTraverser *)CONCAT44(extraout_var_12,iVar5);
  TVar8 = getExplicitLayout(pTVar15,pTVar12);
  iVar5 = (*(pTVar15->super_TIntermTraverser)._vptr_TIntermTraverser[0xb])(pTVar15);
  filename = (char *)0x0;
  IVar9 = convertGlslangToSpvType
                    (this,(TType *)pTVar15,TVar8,(TQualifier *)CONCAT44(extraout_var_13,iVar5),false
                     ,false);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
  (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar5) + 0x10))
            ((long *)CONCAT44(extraout_var_14,iVar5),this);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
  plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_15,iVar5) + 0x18))
                              ((long *)CONCAT44(extraout_var_15,iVar5));
  pTVar12 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
  rValue = accessChainLoad(this,pTVar12);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
  (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar5) + 0x10))
            ((long *)CONCAT44(extraout_var_16,iVar5),this);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
  plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar5) + 0x18))
                              ((long *)CONCAT44(extraout_var_17,iVar5));
  pTVar12 = (TType *)(**(code **)(*plVar13 + 0xf0))(plVar13);
  rValue_00 = accessChainLoad(this,pTVar12);
  iVar5 = (**(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(node);
  iVar5 = *(int *)(CONCAT44(extraout_var_18,iVar5) + 0xc);
  iVar7 = (**(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(node);
  if (*(long *)CONCAT44(extraout_var_19,iVar7) != 0) {
    filename = *(char **)(*(long *)CONCAT44(extraout_var_19,iVar7) + 8);
  }
  spv::Builder::setDebugSourceLocation(pBVar1,iVar5,filename);
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(node);
  if (iVar5 == 0) goto LAB_00438afb;
  iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(node);
  if (iVar5 == 0) {
LAB_004388fc:
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    lVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_33,iVar5) + 0x58))
                       ((long *)CONCAT44(extraout_var_33,iVar5));
    DVar18 = DecorationMax;
    if ((*(uint *)(lVar14 + 8) >> 0x19 & 7) - 1 < 2) {
      DVar18 = DecorationRelaxedPrecision;
    }
    IVar9 = spv::Builder::createVariable(pBVar1,DVar18,Function,IVar9,(char *)0x0,0,true);
    uVar11 = (node->dontFlatten & 1) * 2;
    if (node->flatten != false) {
      uVar11 = 1;
    }
    spv::Builder::If::If(&local_68,IVar6,uVar11,pBVar1);
    spv::Builder::clearAccessChain(pBVar1);
    spv::Builder::setAccessChainLValue(pBVar1,IVar9);
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    multiTypeStore(this,(TType *)CONCAT44(extraout_var_34,iVar5),rValue);
    spv::Builder::If::makeBeginElse(&local_68);
    spv::Builder::clearAccessChain(pBVar1);
    spv::Builder::setAccessChainLValue(pBVar1,IVar9);
    iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
    multiTypeStore(this,(TType *)CONCAT44(extraout_var_35,iVar5),rValue_00);
    spv::Builder::If::makeEndIf(&local_68);
    spv::Builder::clearAccessChain(pBVar1);
    spv::Builder::setAccessChainLValue(pBVar1,IVar9);
  }
  else {
    if ((this->glslangIntermediate->spvVersion).spv < 0x10400) {
      iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
      cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar5) + 0xc0))
                        ((long *)CONCAT44(extraout_var_20,iVar5));
      if (cVar3 == '\0') {
        iVar5 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(node);
        cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar5) + 0xd8))
                          ((long *)CONCAT44(extraout_var_21,iVar5));
        if (cVar3 == '\0') goto LAB_004388fc;
      }
    }
    if ((this->glslangIntermediate->spvVersion).spv < 0x10400) {
      ppIVar16 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      pIVar2 = ppIVar16[rValue];
      if (pIVar2 == (Instruction *)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17 = (ulong)pIVar2->typeId;
      }
      if (ppIVar16[uVar17]->opCode == OpTypeVector) {
        IVar10 = spv::Builder::makeBoolType(pBVar1);
        pIVar2 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[rValue];
        if (pIVar2 == (Instruction *)0x0) {
          typeId = 0;
        }
        else {
          typeId = pIVar2->typeId;
        }
        uVar11 = spv::Builder::getNumTypeConstituents(pBVar1,typeId);
        IVar10 = spv::Builder::makeVectorType(pBVar1,IVar10,uVar11);
        IVar6 = spv::Builder::smearScalar(pBVar1,DecorationMax,IVar6,IVar10);
      }
    }
    ppIVar16 = (this->builder).module.idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppIVar16[rValue] == (Instruction *)0x0) {
      IVar10 = 0;
    }
    else {
      IVar10 = ppIVar16[rValue]->typeId;
    }
    if (IVar10 != IVar9) {
      rValue = spv::Builder::createUnaryOp(pBVar1,OpCopyLogical,IVar9,rValue);
      ppIVar16 = (this->builder).module.idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
    }
    if (ppIVar16[rValue_00] == (Instruction *)0x0) {
      IVar10 = 0;
    }
    else {
      IVar10 = ppIVar16[rValue_00]->typeId;
    }
    if (IVar10 != IVar9) {
      rValue_00 = spv::Builder::createUnaryOp(pBVar1,OpCopyLogical,IVar9,rValue_00);
    }
    IVar6 = spv::Builder::createTriOp(pBVar1,OpSelect,IVar9,IVar6,rValue,rValue_00);
    spv::Builder::clearAccessChain(pBVar1);
    (this->builder).accessChain.isRValue = true;
    (this->builder).accessChain.base = IVar6;
  }
LAB_00438afb:
  (this->builder).generatingOpCodeForSpecConst = bVar4;
  return false;
}

Assistant:

bool TGlslangToSpvTraverser::visitSelection(glslang::TVisit /* visit */, glslang::TIntermSelection* node)
{
    // see if OpSelect can handle it
    const auto isOpSelectable = [&]() {
        if (node->getBasicType() == glslang::EbtVoid)
            return false;
        // OpSelect can do all other types starting with SPV 1.4
        if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_4) {
            // pre-1.4, only scalars and vectors can be handled
            if ((!node->getType().isScalar() && !node->getType().isVector()))
                return false;
        }
        return true;
    };

    // See if it simple and safe, or required, to execute both sides.
    // Crucially, side effects must be either semantically required or avoided,
    // and there are performance trade-offs.
    // Return true if required or a good idea (and safe) to execute both sides,
    // false otherwise.
    const auto bothSidesPolicy = [&]() -> bool {
        // do we have both sides?
        if (node->getTrueBlock()  == nullptr ||
            node->getFalseBlock() == nullptr)
            return false;

        // required? (unless we write additional code to look for side effects
        // and make performance trade-offs if none are present)
        if (!node->getShortCircuit())
            return true;

        // if not required to execute both, decide based on performance/practicality...

        if (!isOpSelectable())
            return false;

        assert(node->getType() == node->getTrueBlock() ->getAsTyped()->getType() &&
               node->getType() == node->getFalseBlock()->getAsTyped()->getType());

        // return true if a single operand to ? : is okay for OpSelect
        const auto operandOkay = [](glslang::TIntermTyped* node) {
            return node->getAsSymbolNode() || node->getType().getQualifier().isConstant();
        };

        return operandOkay(node->getTrueBlock() ->getAsTyped()) &&
               operandOkay(node->getFalseBlock()->getAsTyped());
    };

    spv::Id result = spv::NoResult; // upcoming result selecting between trueValue and falseValue
    // emit the condition before doing anything with selection
    node->getCondition()->traverse(this);
    spv::Id condition = accessChainLoad(node->getCondition()->getType());

    // Find a way of executing both sides and selecting the right result.
    const auto executeBothSides = [&]() -> void {
        // execute both sides
        spv::Id resultType = convertGlslangToSpvType(node->getType());
        node->getTrueBlock()->traverse(this);
        spv::Id trueValue = accessChainLoad(node->getTrueBlock()->getAsTyped()->getType());
        node->getFalseBlock()->traverse(this);
        spv::Id falseValue = accessChainLoad(node->getFalseBlock()->getAsTyped()->getType());

        builder.setDebugSourceLocation(node->getLoc().line, node->getLoc().getFilename());

        // done if void
        if (node->getBasicType() == glslang::EbtVoid)
            return;

        // emit code to select between trueValue and falseValue
        // see if OpSelect can handle the result type, and that the SPIR-V types
        // of the inputs match the result type.
        if (isOpSelectable()) {
            // Emit OpSelect for this selection.

            // smear condition to vector, if necessary (AST is always scalar)
            // Before 1.4, smear like for mix(), starting with 1.4, keep it scalar
            if (glslangIntermediate->getSpv().spv < glslang::EShTargetSpv_1_4 && builder.isVector(trueValue)) {
                condition = builder.smearScalar(spv::NoPrecision, condition,
                                                builder.makeVectorType(builder.makeBoolType(),
                                                                       builder.getNumComponents(trueValue)));
            }

            // If the types do not match, it is because of mismatched decorations on aggregates.
            // Since isOpSelectable only lets us get here for SPIR-V >= 1.4, we can use OpCopyObject
            // to get matching types.
            if (builder.getTypeId(trueValue) != resultType) {
                trueValue = builder.createUnaryOp(spv::OpCopyLogical, resultType, trueValue);
            }
            if (builder.getTypeId(falseValue) != resultType) {
                falseValue = builder.createUnaryOp(spv::OpCopyLogical, resultType, falseValue);
            }

            // OpSelect
            result = builder.createTriOp(spv::OpSelect, resultType, condition, trueValue, falseValue);

            builder.clearAccessChain();
            builder.setAccessChainRValue(result);
        } else {
            // We need control flow to select the result.
            // TODO: Once SPIR-V OpSelect allows arbitrary types, eliminate this path.
            result = builder.createVariable(TranslatePrecisionDecoration(node->getType()),
                spv::StorageClassFunction, resultType);

            // Selection control:
            const spv::SelectionControlMask control = TranslateSelectionControl(*node);

            // make an "if" based on the value created by the condition
            spv::Builder::If ifBuilder(condition, control, builder);

            // emit the "then" statement
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
            multiTypeStore(node->getType(), trueValue);

            ifBuilder.makeBeginElse();
            // emit the "else" statement
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
            multiTypeStore(node->getType(), falseValue);

            // finish off the control flow
            ifBuilder.makeEndIf();

            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
        }
    };

    // Execute the one side needed, as per the condition
    const auto executeOneSide = [&]() {
        // Always emit control flow.
        if (node->getBasicType() != glslang::EbtVoid) {
            result = builder.createVariable(TranslatePrecisionDecoration(node->getType()), spv::StorageClassFunction,
                convertGlslangToSpvType(node->getType()));
        }

        // Selection control:
        const spv::SelectionControlMask control = TranslateSelectionControl(*node);

        // make an "if" based on the value created by the condition
        spv::Builder::If ifBuilder(condition, control, builder);

        // emit the "then" statement
        if (node->getTrueBlock() != nullptr) {
            node->getTrueBlock()->traverse(this);
            if (result != spv::NoResult) {
                spv::Id load = accessChainLoad(node->getTrueBlock()->getAsTyped()->getType());

                builder.clearAccessChain();
                builder.setAccessChainLValue(result);
                multiTypeStore(node->getType(), load);
            }
        }

        if (node->getFalseBlock() != nullptr) {
            ifBuilder.makeBeginElse();
            // emit the "else" statement
            node->getFalseBlock()->traverse(this);
            if (result != spv::NoResult) {
                spv::Id load = accessChainLoad(node->getFalseBlock()->getAsTyped()->getType());

                builder.clearAccessChain();
                builder.setAccessChainLValue(result);
                multiTypeStore(node->getType(), load);
            }
        }

        // finish off the control flow
        ifBuilder.makeEndIf();

        if (result != spv::NoResult) {
            builder.clearAccessChain();
            builder.setAccessChainLValue(result);
        }
    };

    // Try for OpSelect (or a requirement to execute both sides)
    if (bothSidesPolicy()) {
        SpecConstantOpModeGuard spec_constant_op_mode_setter(&builder);
        if (node->getType().getQualifier().isSpecConstant())
            spec_constant_op_mode_setter.turnOnSpecConstantOpMode();
        executeBothSides();
    } else
        executeOneSide();

    return false;
}